

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::
WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          size_t *nextreturnperiod_index,double *last_return_period,OASIS_FLOAT *last_loss,
          double current_return_period,OASIS_FLOAT current_loss,int summary_id,int eptype,int epcalc
          ,double max_retperiod,int counter,OASIS_FLOAT tvar,
          map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail,offset_in_aggreports_to_subr WriteOutput,
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          *mean_map)

{
  int *piVar1;
  pointer piVar2;
  pointer pmVar3;
  bool bVar4;
  ulong uVar5;
  code *pcVar6;
  mapped_type *pmVar7;
  aggreports *this_00;
  aggreports *in_stack_00000038;
  float local_88;
  int local_84;
  double local_80;
  float local_78;
  float local_74;
  double local_70;
  double *local_68;
  float *local_60;
  long *local_58;
  double local_50;
  vector<int,_std::allocator<int>_> *local_48;
  double local_40;
  double local_38;
  
  bVar4 = current_return_period != 0.0;
  local_50 = (double)current_loss;
  local_58 = (long *)((long)&this->totalperiods_ + (long)&mean_map->_M_t);
  uVar5 = *nextreturnperiod_index;
  local_84 = summary_id;
  local_78 = current_loss;
  local_74 = tvar;
  local_70 = current_return_period;
  local_68 = last_return_period;
  local_60 = last_loss;
  local_48 = fileIDs;
  local_38 = max_retperiod;
  do {
    piVar2 = (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar5) {
      return;
    }
    local_80 = (double)piVar2[uVar5];
    if (local_80 < current_return_period) break;
    if (local_80 <= local_38) {
      local_88 = 0.0;
      if (current_loss != 0.0 && bVar4) {
        local_88 = local_78;
        if (((local_80 != current_return_period) || (NAN(local_80) || NAN(current_return_period)))
           && (local_88 = -1.0, current_return_period < local_80)) {
          local_88 = (float)((((double)*local_60 - local_50) * (local_80 - current_return_period)) /
                             (*local_68 - current_return_period) + local_50);
        }
      }
      if (WriteOutput != 0) {
        pcVar6 = (code *)WriteOutput;
        if ((WriteOutput & 1) != 0) {
          pcVar6 = *(code **)(*local_58 + -1 + WriteOutput);
        }
        (*pcVar6)(local_80,local_58,local_48,local_84,epcalc,eptype);
        current_return_period = local_70;
      }
      this_00 = in_stack_00000038;
      if (in_stack_00000038 != (aggreports *)0x0) {
        pmVar7 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)in_stack_00000038,&local_84);
        (pmVar7->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
        super__Vector_impl_data._M_start[*nextreturnperiod_index].retperiod = local_80;
        local_40 = (double)local_88;
        pmVar7 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)in_stack_00000038,&local_84);
        pmVar3 = (pmVar7->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pmVar3[*nextreturnperiod_index].mean = local_40 + pmVar3[*nextreturnperiod_index].mean;
        pmVar7 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)in_stack_00000038,&local_84);
        piVar1 = &(pmVar7->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
                  super__Vector_impl_data._M_start[*nextreturnperiod_index].count;
        *piVar1 = *piVar1 + 1;
        current_return_period = local_70;
      }
      if ((current_return_period != 0.0) || (NAN(current_return_period))) {
        local_74 = local_74 - (local_74 - local_88) / (float)counter;
        FillTVaR(this_00,tail,local_84,epcalc,local_80,local_74);
        current_return_period = local_70;
      }
      uVar5 = *nextreturnperiod_index + 1;
      *nextreturnperiod_index = uVar5;
      counter = counter + 1;
    }
    else {
      uVar5 = uVar5 + 1;
      *nextreturnperiod_index = uVar5;
    }
  } while (current_return_period <= local_80);
  if (0.0 < current_return_period) {
    *local_68 = current_return_period;
    *local_60 = local_78;
  }
  return;
}

Assistant:

void aggreports::WriteReturnPeriodOut(const std::vector<int> &fileIDs,
	size_t &nextreturnperiod_index, double &last_return_period,
	OASIS_FLOAT &last_loss, const double current_return_period,
	const OASIS_FLOAT current_loss, const int summary_id, const int eptype,
	const int epcalc, const double max_retperiod, int counter,
	OASIS_FLOAT tvar, T &tail,
	void (aggreports::*WriteOutput)(const std::vector<int>&, const int,
					const int, const int, const double,
					const OASIS_FLOAT),
	std::map<int, std::vector<mean_count>> *mean_map)
#endif
{

  double nextreturnperiod_value = 0;

  do {

    if (nextreturnperiod_index >= returnperiods_.size()) return;

    nextreturnperiod_value = returnperiods_[nextreturnperiod_index];

    if (current_return_period > nextreturnperiod_value) break;

    if (max_retperiod < nextreturnperiod_value) {
      nextreturnperiod_index++;
      continue;
    }

    OASIS_FLOAT loss = GetLoss(nextreturnperiod_value, last_return_period,
			       last_loss, current_return_period, current_loss);
    if (WriteOutput != nullptr) {
    	(this->*WriteOutput)(fileIDs, summary_id, epcalc, eptype,
			     nextreturnperiod_value, loss);
    }
    if (mean_map != nullptr) {   // Wheatsheaf Mean with period weights
      (*mean_map)[summary_id][nextreturnperiod_index].retperiod = nextreturnperiod_value;
      (*mean_map)[summary_id][nextreturnperiod_index].mean += loss;
      (*mean_map)[summary_id][nextreturnperiod_index].count++;
    }
#ifdef ORD_OUTPUT
    if (parquetFileNames_[EPT] != "") {
      WriteParquetOutput(os, summary_id, epcalc, eptype,
			 nextreturnperiod_value, loss);
    }
#endif

    // Tail Value at Risk makes no sense for return period = 0
    if (current_return_period != 0) {
      tvar = tvar - ((tvar - loss) / counter);
      FillTVaR(tail, summary_id, epcalc, nextreturnperiod_value, tvar);
    }

    nextreturnperiod_index++;
    counter++;

  } while (current_return_period <= nextreturnperiod_value);

  if (current_return_period > 0) {
    last_return_period = current_return_period;
    last_loss = current_loss;
  }

}